

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O2

bool Jinx::Impl::StringToInteger(String *value,int64_t *outValue)

{
  longlong lVar1;
  char *endPtr;
  
  if (outValue != (int64_t *)0x0) {
    lVar1 = strtoll((value->_M_dataplus)._M_p,&endPtr,10);
    *outValue = lVar1;
    return endPtr == (value->_M_dataplus)._M_p + value->_M_string_length;
  }
  __assert_fail("outValue",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxConversion.cpp"
                ,0x82,"bool Jinx::Impl::StringToInteger(const String &, int64_t *)");
}

Assistant:

inline_t bool StringToInteger(const String & value, int64_t * outValue)
	{
		assert(outValue);
#ifdef JINX_USE_FROM_CHARS
		auto result = std::from_chars(value.data(), value.data() + value.size(), *outValue);
		if (result.ptr == value.data() + value.size())
			return true;
		return false;
#else
		char * endPtr;
		*outValue = strtoll(value.data(), &endPtr, 10);
		if (endPtr != (value.data() + value.size()))
			return false;
		return true;
#endif
	}